

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O1

float32 float32_exp2_x86_64(float32 a,float_status *status)

{
  float32 fVar1;
  float64 fVar2;
  float64 b;
  float64 b_00;
  uint uVar3;
  long lVar4;
  float64 a_00;
  
  if ((status->flush_inputs_to_zero != '\0') && ((a & 0x7fffff) != 0 && (a & 0x7f800000) == 0)) {
    status->float_exception_flags = status->float_exception_flags | 0x40;
    a = a & 0x80000000;
  }
  uVar3 = a >> 0x17 & 0xff;
  if (uVar3 == 0xff) {
    if ((a & 0x7fffff) != 0) {
      fVar1 = propagateFloat32NaN(a,0,status);
      return fVar1;
    }
    fVar1 = 0;
    if (0 < (int)a) {
      fVar1 = a;
    }
  }
  else {
    if (uVar3 != 0 || (a & 0x7fffff) != 0) {
      status->float_exception_flags = status->float_exception_flags | 0x20;
      fVar2 = float32_to_float64_x86_64(a,status);
      b = float64_mul_x86_64(fVar2,0x3fe62e42fefa39ef,status);
      a_00 = 0x3ff0000000000000;
      lVar4 = 0;
      fVar2 = b;
      do {
        b_00 = float64_mul_x86_64(fVar2,*(float64 *)((long)float32_exp2_coefficients + lVar4),status
                                 );
        a_00 = float64_add_x86_64(a_00,b_00,status);
        fVar2 = float64_mul_x86_64(fVar2,b,status);
        lVar4 = lVar4 + 8;
      } while (lVar4 != 0x78);
      fVar1 = float64_to_float32_x86_64(a_00,status);
      return fVar1;
    }
    fVar1 = 0x3f800000;
  }
  return fVar1;
}

Assistant:

float32 float32_exp2(float32 a, float_status *status)
{
    flag aSign;
    int aExp;
    uint32_t aSig;
    float64 r, x, xn;
    int i;
    a = float32_squash_input_denormal(a, status);

    aSig = extractFloat32Frac( a );
    aExp = extractFloat32Exp( a );
    aSign = extractFloat32Sign( a );

    if ( aExp == 0xFF) {
        if (aSig) {
            return propagateFloat32NaN(a, float32_zero, status);
        }
        return (aSign) ? float32_zero : a;
    }
    if (aExp == 0) {
        if (aSig == 0) return float32_one;
    }

    float_raise(float_flag_inexact, status);

    /* ******************************* */
    /* using float64 for approximation */
    /* ******************************* */
    x = float32_to_float64(a, status);
    x = float64_mul(x, float64_ln2, status);

    xn = x;
    r = float64_one;
    for (i = 0 ; i < 15 ; i++) {
        float64 f;

        f = float64_mul(xn, float32_exp2_coefficients[i], status);
        r = float64_add(r, f, status);

        xn = float64_mul(xn, x, status);
    }

    return float64_to_float32(r, status);
}